

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t assertion_make_dir(char *file,wchar_t line,char *dirname,wchar_t mode)

{
  int iVar1;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = mkdir(dirname,mode);
  if ((iVar1 == 0) && (iVar1 = chmod(dirname,mode), iVar1 == 0)) {
    assertion_file_mode(file,line,dirname,mode);
    return L'\x01';
  }
  failure_start(file,line,"Could not create directory %s",dirname);
  failure_finish(file);
  return L'\0';
}

Assistant:

int
assertion_make_dir(const char *file, int line, const char *dirname, int mode)
{
	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	(void)mode; /* UNUSED */
	if (0 == _mkdir(dirname))
		return (1);
#else
	if (0 == mkdir(dirname, (mode_t)mode)) {
		if (0 == chmod(dirname, (mode_t)mode)) {
			assertion_file_mode(file, line, dirname, mode);
			return (1);
		}
	}
#endif
	failure_start(file, line, "Could not create directory %s", dirname);
	failure_finish(NULL);
	return(0);
}